

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  ArrayIndex AVar1;
  ostringstream *this_00;
  ArrayIndex AVar2;
  string sStack_1e8;
  Value local_1c8;
  ostringstream oss;
  
  this_00 = (ostringstream *)(ulong)newSize;
  if (this->field_0x8 != '\0') {
    if (this->field_0x8 == '\x06') goto LAB_00142f23;
    this_00 = (ostringstream *)&oss;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"in Json::Value::resize(): requires arrayValue");
    std::__cxx11::stringbuf::str();
    throwLogicError(&sStack_1e8);
  }
  newSize = (ArrayIndex)this_00;
  Value(&local_1c8,arrayValue);
  swap(this,&local_1c8);
  ~Value(&local_1c8);
LAB_00142f23:
  AVar1 = size(this);
  if (newSize == 0) {
    clear(this);
    return;
  }
  if (AVar1 < newSize) {
    operator[](this,newSize - 1);
    return;
  }
  for (AVar2 = newSize; AVar1 != AVar2; AVar2 = AVar2 + 1) {
    _oss = (char *)0x0;
    std::
    _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::erase(&((this->value_).map_)->_M_t,(CZString *)&oss);
    CZString::~CZString((CZString *)&oss);
  }
  AVar1 = size(this);
  if (AVar1 == newSize) {
    return;
  }
  __assert_fail("size() == newSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_value.cpp"
                ,0x394,"void Json::Value::resize(ArrayIndex)");
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    (*this)[newSize - 1];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    assert(size() == newSize);
  }
}